

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O0

int Saig_ManBmcTerSimCount01(Aig_Man_t *p,uint *pInfo)

{
  Vec_Ptr_t *p_00;
  int iVar1;
  Aig_Obj_t *pObj_00;
  Aig_Obj_t *pObj_01;
  int local_30;
  int local_2c;
  int Counter;
  int i;
  Aig_Obj_t *pObj;
  uint *pInfo_local;
  Aig_Man_t *p_local;
  
  local_30 = 0;
  if (pInfo == (uint *)0x0) {
    p_local._4_4_ = Saig_ManRegNum(p);
  }
  else {
    for (local_2c = 0; iVar1 = Saig_ManRegNum(p), local_2c < iVar1; local_2c = local_2c + 1) {
      p_00 = p->vCos;
      iVar1 = Saig_ManPoNum(p);
      pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(p_00,local_2c + iVar1);
      pObj_01 = Aig_ObjFanin0(pObj_00);
      iVar1 = Aig_ObjIsConst1(pObj_01);
      if (iVar1 == 0) {
        iVar1 = Saig_ManBmcSimInfoGet(pInfo,pObj_00);
        local_30 = (uint)(iVar1 != 3) + local_30;
      }
    }
    p_local._4_4_ = local_30;
  }
  return p_local._4_4_;
}

Assistant:

int Saig_ManBmcTerSimCount01( Aig_Man_t * p, unsigned * pInfo )
{
    Aig_Obj_t * pObj;
    int i, Counter = 0;
    if ( pInfo == NULL )
        return Saig_ManRegNum(p);
    Saig_ManForEachLi( p, pObj, i )
        if ( !Aig_ObjIsConst1(Aig_ObjFanin0(pObj)) )
            Counter += (Saig_ManBmcSimInfoGet(pInfo, pObj) != SAIG_TER_UND);
    return Counter;
}